

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_can_read(player *p,_Bool show_msg)

{
  _Bool _Var1;
  _Bool show_msg_local;
  player *p_local;
  
  if (p->timed[2] == 0) {
    _Var1 = no_light(p);
    if (_Var1) {
      if (show_msg) {
        msg("You have no light to read by.");
      }
      p_local._7_1_ = false;
    }
    else if (p->timed[4] == 0) {
      if (p->timed[0x19] == 0) {
        p_local._7_1_ = true;
      }
      else {
        if (show_msg) {
          msg("You can\'t remember how to read!");
        }
        p_local._7_1_ = false;
      }
    }
    else {
      if (show_msg) {
        msg("You are too confused to read!");
      }
      p_local._7_1_ = false;
    }
  }
  else {
    if (show_msg) {
      msg("You can\'t see anything.");
    }
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool player_can_read(const struct player *p, bool show_msg)
{
	if (p->timed[TMD_BLIND]) {
		if (show_msg)
			msg("You can't see anything.");

		return false;
	}

	if (no_light(p)) {
		if (show_msg)
			msg("You have no light to read by.");

		return false;
	}

	if (p->timed[TMD_CONFUSED]) {
		if (show_msg)
			msg("You are too confused to read!");

		return false;
	}

	if (p->timed[TMD_AMNESIA]) {
		if (show_msg)
			msg("You can't remember how to read!");

		return false;
	}

	return true;
}